

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRewrite.c
# Opt level: O3

int Abc_NtkRewrite(Abc_Ntk_t *pNtk,int fUpdateLevel,int fUseZeros,int fVerbose,int fVeryVerbose,
                  int fPlaceEnable)

{
  Abc_Obj_t *pNode;
  int iVar1;
  int iVar2;
  int iVar3;
  Rwr_Man_t *pRVar4;
  Cut_Man_t *p;
  Vec_Int_t *vFanCounts;
  ProgressBar *p_00;
  Vec_Ptr_t *pVVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  char *__assertion;
  bool bVar9;
  timespec ts;
  timespec local_80;
  int local_6c;
  Rwr_Man_t *local_68;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  Dec_Graph_t *local_50;
  int local_44;
  long local_40;
  long local_38;
  
  local_6c = fUpdateLevel;
  local_54 = fPlaceEnable;
  local_44 = fUseZeros;
  iVar1 = clock_gettime(3,&local_80);
  if (iVar1 < 0) {
    lVar6 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_80.tv_nsec),8);
    lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_80.tv_sec * -1000000;
  }
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRewrite.c"
                  ,0x49,"int Abc_NtkRewrite(Abc_Ntk_t *, int, int, int, int, int)");
  }
  Abc_AigCleanup((Abc_Aig_t *)pNtk->pManFunc);
  iVar1 = 0;
  pRVar4 = Rwr_ManStart(0);
  if (pRVar4 != (Rwr_Man_t *)0x0) {
    if (local_6c != 0) {
      Abc_NtkStartReverseLevels(pNtk,0);
    }
    local_5c = fVerbose;
    iVar1 = clock_gettime(3,&local_80);
    if (iVar1 < 0) {
      lVar7 = 1;
    }
    else {
      lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_80.tv_nsec),8);
      lVar7 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_80.tv_sec * -1000000;
    }
    Abc_NtkStartCutManForRewrite_Params._32_8_ = 0;
    Abc_NtkStartCutManForRewrite_Params._40_8_ = 0;
    Abc_NtkStartCutManForRewrite_Params._48_8_ = 0;
    Abc_NtkStartCutManForRewrite_Params._56_8_ = 0;
    Abc_NtkStartCutManForRewrite_Params._64_8_ = 0;
    Abc_NtkStartCutManForRewrite_Params._72_8_ = 0;
    Abc_NtkStartCutManForRewrite_Params._0_8_ = 0xfa00000004;
    Abc_NtkStartCutManForRewrite_Params._16_8_ = 0x100000000;
    Abc_NtkStartCutManForRewrite_Params._24_8_ = 1;
    Abc_NtkStartCutManForRewrite_Params._12_4_ = 0;
    Abc_NtkStartCutManForRewrite_Params._8_4_ = pNtk->vObjs->nSize;
    local_68 = pRVar4;
    local_40 = lVar6;
    p = Cut_ManStart((Cut_Params_t *)Abc_NtkStartCutManForRewrite_Params);
    if (Abc_NtkStartCutManForRewrite_Params._32_4_ != 0) {
      vFanCounts = Abc_NtkFanoutCounts(pNtk);
      Cut_ManSetFanoutCounts(p,vFanCounts);
    }
    pVVar5 = pNtk->vCis;
    if (0 < pVVar5->nSize) {
      lVar6 = 0;
      do {
        if (0 < *(int *)((long)pVVar5->pArray[lVar6] + 0x2c)) {
          Cut_NodeSetTriv(p,*(int *)((long)pVVar5->pArray[lVar6] + 0x10));
          pVVar5 = pNtk->vCis;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < pVVar5->nSize);
    }
    iVar1 = clock_gettime(3,&local_80);
    pRVar4 = local_68;
    if (iVar1 < 0) {
      lVar6 = -1;
    }
    else {
      lVar6 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
    }
    Rwr_ManAddTimeCuts(local_68,lVar6 + lVar7);
    pNtk->pManCut = p;
    local_58 = fVeryVerbose;
    if (fVeryVerbose != 0) {
      Rwr_ScoresClean(pRVar4);
    }
    pRVar4->nNodesBeg = pNtk->nObjCounts[7];
    iVar1 = pNtk->vObjs->nSize;
    p_00 = Extra_ProgressBarStart(_stdout,iVar1);
    pVVar5 = pNtk->vObjs;
    if (0 < pVVar5->nSize) {
      local_38 = (long)iVar1;
      lVar6 = 0;
      do {
        pNode = (Abc_Obj_t *)pVVar5->pArray[lVar6];
        if ((pNode != (Abc_Obj_t *)0x0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) {
          if ((p_00 == (ProgressBar *)0x0) || (p_00->nItemsNext <= lVar6)) {
            Extra_ProgressBarUpdate_int(p_00,(int)lVar6,(char *)0x0);
          }
          if (local_38 <= lVar6) break;
          if (((ulong)pNode & 1) != 0) {
            __assertion = "!Abc_ObjIsComplement(pNode)";
LAB_0029c8ca:
            __assert_fail(__assertion,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                          ,0x18e,"int Abc_AigNodeIsAnd(Abc_Obj_t *)");
          }
          if (pNode->pNtk->ntkType != ABC_NTK_STRASH) {
            __assertion = "Abc_NtkIsStrash(pNode->pNtk)";
            goto LAB_0029c8ca;
          }
          if ((pNode->vFanins).nSize != 2) {
            __assert_fail("Abc_AigNodeIsAnd(pNode)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                          ,0x192,"int Abc_NodeIsPersistant(Abc_Obj_t *)");
          }
          if (((pNode->field_0x15 & 2) == 0) && ((pNode->vFanouts).nSize < 0x3e9)) {
            bVar9 = local_44 != 0;
            iVar1 = Rwr_NodeRewrite(local_68,p,pNode,local_6c,local_44,local_54);
            pRVar4 = local_68;
            if ((0 < iVar1) || (bVar9 && iVar1 == 0)) {
              local_60 = iVar1;
              local_50 = (Dec_Graph_t *)Rwr_ManReadDecs(local_68);
              iVar1 = Rwr_ManReadCompl(pRVar4);
              if (local_54 != 0) {
                Abc_AigUpdateReset((Abc_Aig_t *)pNtk->pManFunc);
              }
              if (iVar1 == 0) {
                iVar1 = clock_gettime(3,&local_80);
                if (iVar1 < 0) {
                  lVar7 = 1;
                }
                else {
                  lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_80.tv_nsec),8);
                  lVar7 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_80.tv_sec * -1000000;
                }
                Dec_GraphUpdateNetwork(pNode,local_50,local_6c,local_60);
                iVar1 = clock_gettime(3,&local_80);
                if (iVar1 < 0) {
                  lVar8 = -1;
                }
                else {
                  lVar8 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
                }
                Rwr_ManAddTimeUpdate(local_68,lVar8 + lVar7);
              }
              else {
                *(byte *)&local_50->eRoot = *(byte *)&local_50->eRoot ^ 1;
                iVar1 = clock_gettime(3,&local_80);
                if (iVar1 < 0) {
                  lVar7 = 1;
                }
                else {
                  lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_80.tv_nsec),8);
                  lVar7 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_80.tv_sec * -1000000;
                }
                Dec_GraphUpdateNetwork(pNode,local_50,local_6c,local_60);
                iVar1 = clock_gettime(3,&local_80);
                if (iVar1 < 0) {
                  lVar8 = -1;
                }
                else {
                  lVar8 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
                }
                Rwr_ManAddTimeUpdate(local_68,lVar8 + lVar7);
                *(byte *)&local_50->eRoot = *(byte *)&local_50->eRoot ^ 1;
              }
            }
          }
        }
        lVar6 = lVar6 + 1;
        pVVar5 = pNtk->vObjs;
      } while (lVar6 < pVVar5->nSize);
    }
    Extra_ProgressBarStop(p_00);
    iVar2 = clock_gettime(3,&local_80);
    iVar3 = local_58;
    iVar1 = local_5c;
    pRVar4 = local_68;
    if (iVar2 < 0) {
      lVar6 = -1;
    }
    else {
      lVar6 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
    }
    Rwr_ManAddTimeTotal(local_68,lVar6 + local_40);
    pRVar4->nNodesEnd = pNtk->nObjCounts[7];
    if (iVar1 != 0) {
      Rwr_ManPrintStats(pRVar4);
    }
    if (iVar3 != 0) {
      Rwr_ScoresReport(pRVar4);
    }
    Rwr_ManStop(pRVar4);
    Cut_ManStop(p);
    pNtk->pManCut = (void *)0x0;
    Abc_NtkReassignIds(pNtk);
    if (local_6c == 0) {
      Abc_NtkLevel(pNtk);
    }
    else {
      Abc_NtkStopReverseLevels(pNtk);
    }
    iVar3 = Abc_NtkCheck(pNtk);
    iVar1 = 1;
    if (iVar3 == 0) {
      puts("Abc_NtkRewrite: The network check has failed.");
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int Abc_NtkRewrite( Abc_Ntk_t * pNtk, int fUpdateLevel, int fUseZeros, int fVerbose, int fVeryVerbose, int fPlaceEnable )
{
    extern void           Dec_GraphUpdateNetwork( Abc_Obj_t * pRoot, Dec_Graph_t * pGraph, int fUpdateLevel, int nGain );
    ProgressBar * pProgress;
    Cut_Man_t * pManCut;
    Rwr_Man_t * pManRwr;
    Abc_Obj_t * pNode;
//    Vec_Ptr_t * vAddedCells = NULL, * vUpdatedNets = NULL;
    Dec_Graph_t * pGraph;
    int i, nNodes, nGain, fCompl;
    abctime clk, clkStart = Abc_Clock();

    assert( Abc_NtkIsStrash(pNtk) );
    // cleanup the AIG
    Abc_AigCleanup((Abc_Aig_t *)pNtk->pManFunc);
/*
    {
        Vec_Vec_t * vParts;
        vParts = Abc_NtkPartitionSmart( pNtk, 50, 1 );
        Vec_VecFree( vParts );
    }
*/

    // start placement package
//    if ( fPlaceEnable )
//    {
//        Abc_PlaceBegin( pNtk );
//        vAddedCells = Abc_AigUpdateStart( pNtk->pManFunc, &vUpdatedNets );
//    }

    // start the rewriting manager
    pManRwr = Rwr_ManStart( 0 );
    if ( pManRwr == NULL )
        return 0;
    // compute the reverse levels if level update is requested
    if ( fUpdateLevel )
        Abc_NtkStartReverseLevels( pNtk, 0 );
    // start the cut manager
clk = Abc_Clock();
    pManCut = Abc_NtkStartCutManForRewrite( pNtk );
Rwr_ManAddTimeCuts( pManRwr, Abc_Clock() - clk );
    pNtk->pManCut = pManCut;

    if ( fVeryVerbose )
        Rwr_ScoresClean( pManRwr );

    // resynthesize each node once
    pManRwr->nNodesBeg = Abc_NtkNodeNum(pNtk);
    nNodes = Abc_NtkObjNumMax(pNtk);
    pProgress = Extra_ProgressBarStart( stdout, nNodes );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        // stop if all nodes have been tried once
        if ( i >= nNodes )
            break;
        // skip persistant nodes
        if ( Abc_NodeIsPersistant(pNode) )
            continue;
        // skip the nodes with many fanouts
        if ( Abc_ObjFanoutNum(pNode) > 1000 )
            continue;

        // for each cut, try to resynthesize it
        nGain = Rwr_NodeRewrite( pManRwr, pManCut, pNode, fUpdateLevel, fUseZeros, fPlaceEnable );
        if ( !(nGain > 0 || (nGain == 0 && fUseZeros)) )
            continue;
        // if we end up here, a rewriting step is accepted

        // get hold of the new subgraph to be added to the AIG
        pGraph = (Dec_Graph_t *)Rwr_ManReadDecs(pManRwr);
        fCompl = Rwr_ManReadCompl(pManRwr);

        // reset the array of the changed nodes
        if ( fPlaceEnable )
            Abc_AigUpdateReset( (Abc_Aig_t *)pNtk->pManFunc );

        // complement the FF if needed
        if ( fCompl ) Dec_GraphComplement( pGraph );
clk = Abc_Clock();
        Dec_GraphUpdateNetwork( pNode, pGraph, fUpdateLevel, nGain );
Rwr_ManAddTimeUpdate( pManRwr, Abc_Clock() - clk );
        if ( fCompl ) Dec_GraphComplement( pGraph );

        // use the array of changed nodes to update placement
//        if ( fPlaceEnable )
//            Abc_PlaceUpdate( vAddedCells, vUpdatedNets );
    }
    Extra_ProgressBarStop( pProgress );
Rwr_ManAddTimeTotal( pManRwr, Abc_Clock() - clkStart );
    // print stats
    pManRwr->nNodesEnd = Abc_NtkNodeNum(pNtk);
    if ( fVerbose )
        Rwr_ManPrintStats( pManRwr );
//        Rwr_ManPrintStatsFile( pManRwr );
    if ( fVeryVerbose )
        Rwr_ScoresReport( pManRwr );
    // delete the managers
    Rwr_ManStop( pManRwr );
    Cut_ManStop( pManCut );
    pNtk->pManCut = NULL;

    // start placement package
//    if ( fPlaceEnable )
//    {
//        Abc_PlaceEnd( pNtk );
//        Abc_AigUpdateStop( pNtk->pManFunc );
//    }

    // put the nodes into the DFS order and reassign their IDs
    {
//        abctime clk = Abc_Clock();
    Abc_NtkReassignIds( pNtk );
//        ABC_PRT( "time", Abc_Clock() - clk );
    }
//    Abc_AigCheckFaninOrder( pNtk->pManFunc );
    // fix the levels
    if ( fUpdateLevel )
        Abc_NtkStopReverseLevels( pNtk );
    else
        Abc_NtkLevel( pNtk );
    // check
    if ( !Abc_NtkCheck( pNtk ) )
    {
        printf( "Abc_NtkRewrite: The network check has failed.\n" );
        return 0;
    }
    return 1;
}